

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_feature_filter.cpp
# Opt level: O0

bool __thiscall
Fossilize::FeatureFilter::Impl::color_blend_state_is_supported
          (Impl *this,VkPipelineColorBlendStateCreateInfo *info,VkDynamicState *dynamic_states,
          uint32_t num_dynamic_states)

{
  VkPipelineColorBlendAttachmentState *pVVar1;
  bool bVar2;
  bool bVar3;
  bool local_52;
  bool local_51;
  uint local_48;
  uint32_t i_1;
  bool advanced_alpha;
  bool advanced_color;
  VkPipelineColorBlendAttachmentState *att;
  uint32_t i;
  bool has_advanced_alpha_blend;
  bool has_advanced_color_blend;
  VkPipelineColorBlendStateCreateFlags supported_flags;
  uint32_t num_dynamic_states_local;
  VkDynamicState *dynamic_states_local;
  VkPipelineColorBlendStateCreateInfo *info_local;
  Impl *this_local;
  
  if ((info->flags & 0xfffffffe) == 0) {
    if (((info->flags & 1) == 0) ||
       ((this->features).rasterization_order_attachment_access.
        rasterizationOrderColorAttachmentAccess != 0)) {
      bVar2 = has_dynamic_state(dynamic_states,num_dynamic_states,
                                VK_DYNAMIC_STATE_LOGIC_OP_ENABLE_EXT);
      if ((bVar2) || ((info->logicOpEnable == 0 || ((this->features2).features.logicOp != 0)))) {
        bVar2 = has_dynamic_state(dynamic_states,num_dynamic_states,
                                  VK_DYNAMIC_STATE_COLOR_BLEND_EQUATION_EXT);
        if ((!bVar2) &&
           (bVar2 = has_dynamic_state(dynamic_states,num_dynamic_states,
                                      VK_DYNAMIC_STATE_COLOR_BLEND_ADVANCED_EXT), !bVar2)) {
          att._7_1_ = false;
          att._6_1_ = false;
          for (att._0_4_ = 0; (uint)att < info->attachmentCount; att._0_4_ = (uint)att + 1) {
            pVVar1 = info->pAttachments;
            bVar2 = blend_op_is_advanced(pVVar1[(uint)att].colorBlendOp);
            bVar3 = blend_op_is_advanced(pVVar1[(uint)att].alphaBlendOp);
            local_51 = true;
            if (att._7_1_ == false) {
              local_51 = bVar2;
            }
            att._7_1_ = local_51;
            local_52 = true;
            if (att._6_1_ == false) {
              local_52 = bVar3;
            }
            att._6_1_ = local_52;
            if ((bVar2) || (bVar3)) {
              if (pVVar1[(uint)att].alphaBlendOp != pVVar1[(uint)att].colorBlendOp) {
                return false;
              }
              if ((this->props).blend_operation_advanced.advancedBlendAllOperations == 0) {
                return false;
              }
            }
          }
          if ((att._7_1_ != false) || (att._6_1_ != false)) {
            if ((this->props).blend_operation_advanced.advancedBlendMaxColorAttachments <
                info->attachmentCount) {
              return false;
            }
            if ((this->props).blend_operation_advanced.advancedBlendIndependentBlend == 0) {
              for (local_48 = 1; local_48 < info->attachmentCount; local_48 = local_48 + 1) {
                if (info->pAttachments[local_48].alphaBlendOp != info->pAttachments->alphaBlendOp) {
                  return false;
                }
                if (info->pAttachments[local_48].colorBlendOp != info->pAttachments->colorBlendOp) {
                  return false;
                }
              }
            }
          }
        }
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool FeatureFilter::Impl::color_blend_state_is_supported(
		const VkPipelineColorBlendStateCreateInfo *info,
		const VkDynamicState *dynamic_states, uint32_t num_dynamic_states) const
{
	constexpr VkPipelineColorBlendStateCreateFlags supported_flags =
			VK_PIPELINE_COLOR_BLEND_STATE_CREATE_RASTERIZATION_ORDER_ATTACHMENT_ACCESS_BIT_EXT;

	if (info->flags & ~supported_flags)
		return false;

	if ((info->flags & VK_PIPELINE_COLOR_BLEND_STATE_CREATE_RASTERIZATION_ORDER_ATTACHMENT_ACCESS_BIT_EXT) != 0 &&
	    features.rasterization_order_attachment_access.rasterizationOrderColorAttachmentAccess == VK_FALSE)
		return false;

	if (!has_dynamic_state(dynamic_states, num_dynamic_states, VK_DYNAMIC_STATE_LOGIC_OP_ENABLE_EXT) &&
	    info->logicOpEnable && !features2.features.logicOp)
	{
		return false;
	}

	if (!has_dynamic_state(dynamic_states, num_dynamic_states, VK_DYNAMIC_STATE_COLOR_BLEND_EQUATION_EXT) &&
	    !has_dynamic_state(dynamic_states, num_dynamic_states, VK_DYNAMIC_STATE_COLOR_BLEND_ADVANCED_EXT))
	{
		bool has_advanced_color_blend = false;
		bool has_advanced_alpha_blend = false;

		for (uint32_t i = 0; i < info->attachmentCount; i++)
		{
			auto &att = info->pAttachments[i];

			bool advanced_color = blend_op_is_advanced(att.colorBlendOp);
			bool advanced_alpha = blend_op_is_advanced(att.alphaBlendOp);
			has_advanced_color_blend = has_advanced_color_blend || advanced_color;
			has_advanced_alpha_blend = has_advanced_alpha_blend || advanced_alpha;

			if (advanced_color || advanced_alpha)
			{
				if (att.alphaBlendOp != att.colorBlendOp)
					return false;
				if (!props.blend_operation_advanced.advancedBlendAllOperations)
					return false;
			}
		}

		if (has_advanced_color_blend || has_advanced_alpha_blend)
		{
			if (info->attachmentCount > props.blend_operation_advanced.advancedBlendMaxColorAttachments)
				return false;

			if (!props.blend_operation_advanced.advancedBlendIndependentBlend)
			{
				for (uint32_t i = 1; i < info->attachmentCount; i++)
				{
					if (info->pAttachments[i].alphaBlendOp != info->pAttachments[0].alphaBlendOp)
						return false;
					if (info->pAttachments[i].colorBlendOp != info->pAttachments[0].colorBlendOp)
						return false;
				}
			}
		}
	}

	return true;
}